

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_get_phseg(acmod_set_t *acmod_set,s3phseg_t **out_phseg)

{
  int iVar1;
  char *fn;
  undefined8 local_28;
  char *rel_path;
  s3phseg_t **out_phseg_local;
  acmod_set_t *acmod_set_local;
  
  if (requires_phseg == 0) {
    acmod_set_local._4_4_ = -1;
  }
  else {
    if (cur_ctl_utt_id == (char *)0x0) {
      local_28 = cur_ctl_path;
    }
    else {
      local_28 = cur_ctl_utt_id;
    }
    fn = mk_filename(4,local_28);
    iVar1 = s3phseg_read(fn,acmod_set,out_phseg);
    if (iVar1 < 0) {
      acmod_set_local._4_4_ = -1;
    }
    else {
      acmod_set_local._4_4_ = 0;
    }
  }
  return acmod_set_local._4_4_;
}

Assistant:

int
corpus_get_phseg(acmod_set_t *acmod_set,
		 s3phseg_t **out_phseg)
{
    char *rel_path;

    if (!requires_phseg) {
	/* asked for seg data, but not set up to send it */
	return S3_ERROR;
    }

    /* If control file specifies an utt ID, use it.  O/W use the path */
    if (cur_ctl_utt_id != NULL)
	rel_path = cur_ctl_utt_id;
    else
	rel_path = cur_ctl_path;

    if (s3phseg_read(mk_filename(DATA_TYPE_PHSEG, rel_path),
		     acmod_set,
		     out_phseg) < 0)
	return S3_ERROR;
    
    return S3_SUCCESS;
}